

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O1

void do_cmd_accept_character(command *cmd)

{
  ushort uVar1;
  player_race *ppVar2;
  player_body *ppVar3;
  bool bVar4;
  player_body *ppVar5;
  undefined6 uVar6;
  player *ppVar7;
  player_body *ppVar8;
  uint8_t uVar9;
  _Bool _Var10;
  int iVar11;
  uint32_t uVar12;
  wchar_t wVar13;
  char *pcVar14;
  equip_slot *peVar15;
  obj_property *poVar16;
  object_kind *kind;
  uint *puVar17;
  object *obj;
  object *poVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  start_item *psVar22;
  ulong uVar23;
  long lVar24;
  char acStack_88 [88];
  
  options_init_cheat();
  iVar11 = (uint)player->hitdie * 0x32 + -0x32;
  iVar21 = iVar11 * 3 + 7;
  if (-1 < iVar11 * 3) {
    iVar21 = iVar11 * 3;
  }
  iVar20 = iVar11 * 5 + 7;
  if (-1 < iVar11 * 5) {
    iVar20 = iVar11 * 5;
  }
  lVar24 = 1;
  do {
    do {
      uVar12 = Rand_div((uint)player->hitdie);
      ppVar7 = player;
      player->player_hp[lVar24] = (short)uVar12 + player->player_hp[lVar24 + -1] + 1;
      lVar24 = lVar24 + 1;
    } while (lVar24 != 0x32);
    lVar24 = 1;
  } while (((int)ppVar7->player_hp[0x31] < (iVar21 >> 3) + 0x32) ||
          ((iVar20 >> 3) + 0x32 < (int)ppVar7->player_hp[0x31]));
  ignore_birth_init();
  history_clear(player);
  history_add(player,"Began the quest to destroy Morgoth.",L'\x01');
  message_add(" ",0);
  message_add("  ",0);
  message_add("====================",0);
  message_add("  ",0);
  message_add(" ",0);
  ppVar8 = bodies;
  ppVar7 = player;
  ppVar2 = player->race;
  if (ppVar2 == (player_race *)0x0) {
    __assert_fail("p->race",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-birth.c"
                  ,0x176,"void player_embody(struct player *)");
  }
  ppVar3 = bodies[ppVar2->body].next;
  pcVar14 = bodies[ppVar2->body].name;
  ppVar5 = bodies + ppVar2->body;
  uVar6 = *(undefined6 *)&ppVar5->field_0x12;
  peVar15 = *(equip_slot **)(&ppVar5->count + 4);
  (ppVar7->body).count = ppVar5->count;
  *(undefined6 *)&(ppVar7->body).field_0x12 = uVar6;
  (ppVar7->body).slots = peVar15;
  (ppVar7->body).next = ppVar3;
  (ppVar7->body).name = pcVar14;
  my_strcpy(acStack_88,ppVar8[ppVar2->body].name,0x50);
  pcVar14 = string_make(acStack_88);
  (ppVar7->body).name = pcVar14;
  peVar15 = (equip_slot *)mem_zalloc((ulong)(ppVar7->body).count << 5);
  (ppVar7->body).slots = peVar15;
  if ((ppVar7->body).count != 0) {
    lVar24 = 0;
    uVar23 = 0;
    do {
      peVar15 = bodies[ppVar7->race->body].slots;
      *(undefined2 *)((long)&((ppVar7->body).slots)->type + lVar24) =
           *(undefined2 *)((long)&peVar15->type + lVar24);
      my_strcpy(acStack_88,*(char **)((long)&peVar15->name + lVar24),0x50);
      pcVar14 = string_make(acStack_88);
      *(char **)((long)&((ppVar7->body).slots)->name + lVar24) = pcVar14;
      uVar23 = uVar23 + 1;
      lVar24 = lVar24 + 0x20;
    } while (uVar23 < (ppVar7->body).count);
  }
  ppVar7 = player;
  uVar1 = z_info->start_gold;
  player->au_birth = (uint)uVar1;
  ppVar7->au = (uint)uVar1;
  player_spells_init(ppVar7);
  if ((player->opts).opt[0x29] == true) {
    player_learn_all_runes(player);
  }
  poVar18 = player->obj_k;
  poVar18->to_a = 1;
  poVar18->to_h = 1;
  poVar18->to_d = 1;
  store_reset();
  chunk_list_max = 0;
  player_learn_innate(player);
  cleanup_parser(&randart_parser);
  deactivate_randart_file();
  run_parser(&artifact_parser);
  if ((player->opts).opt[0x1e] == true) {
    seed_randart = Rand_div(0x10000000);
    do_randart(seed_randart,true);
    deactivate_randart_file();
  }
  seed_flavor = Rand_div(0x10000000);
  flavor_init();
  if ((player->opts).opt[0x2a] == true) {
    flavor_set_all_aware();
  }
  ppVar7 = player;
  player->upkeep->total_weight = L'\0';
  poVar18 = ppVar7->obj_k;
  poVar18->dd = '\x01';
  poVar18->ds = '\x01';
  poVar18->ac = 1;
  iVar21 = 1;
  do {
    poVar16 = lookup_obj_property(3,iVar21);
    if (poVar16->subtype == L'\x04') {
      flag_on_dbg(ppVar7->obj_k->flags,5,iVar21,"p->obj_k->flags","i");
    }
    if (poVar16->subtype == L'\a') {
      flag_on_dbg(ppVar7->obj_k->flags,5,iVar21,"p->obj_k->flags","i");
    }
    if (poVar16->subtype == L'\b') {
      flag_on_dbg(ppVar7->obj_k->flags,5,iVar21,"p->obj_k->flags","i");
    }
    if (poVar16->subtype == L'\t') {
      flag_on_dbg(ppVar7->obj_k->flags,5,iVar21,"p->obj_k->flags","i");
    }
    iVar21 = iVar21 + 1;
  } while (iVar21 != 0x27);
  psVar22 = ppVar7->class->start_items;
  if (psVar22 != (start_item *)0x0) {
    do {
      iVar21 = rand_range(psVar22->min,psVar22->max);
      uVar9 = (uint8_t)iVar21;
      kind = lookup_kind(psVar22->tval,psVar22->sval);
      if (kind == (object_kind *)0x0) {
        __assert_fail("kind",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-birth.c"
                      ,0x261,"void player_outfit(struct player *)");
      }
      if ((ppVar7->opts).opt[0x27] == false) {
        _Var10 = tval_is_food_k(kind);
        uVar9 = '\x01';
        if ((_Var10) || (_Var10 = tval_is_light_k(kind), _Var10)) goto LAB_001a21f6;
      }
      else {
LAB_001a21f6:
        puVar17 = (uint *)psVar22->eopts;
        if ((puVar17 != (uint *)0x0) && (uVar19 = *puVar17, uVar19 != 0)) {
          bVar4 = true;
          do {
            puVar17 = puVar17 + 1;
            if ((int)uVar19 < 1) {
              if ((ppVar7->opts).opt[-uVar19] == false) {
                bVar4 = false;
              }
            }
            else if ((ppVar7->opts).opt[uVar19] != false) {
              bVar4 = false;
            }
            uVar19 = *puVar17;
          } while ((uVar19 != 0) && (bVar4));
          if (!bVar4) goto LAB_001a22dd;
        }
        obj = object_new();
        object_prep(obj,kind,L'\0',MINIMISE);
        obj->number = uVar9;
        obj->origin = '\x12';
        poVar18 = object_new();
        obj->known = poVar18;
        object_set_base_known(ppVar7,obj);
        object_flavor_aware(ppVar7,obj);
        poVar18 = obj->known;
        poVar18->pval = obj->pval;
        poVar18->effect = obj->effect;
        poVar18->notice = poVar18->notice | 2;
        wVar13 = object_value_real(obj,(uint)obj->number);
        ppVar7->au = ppVar7->au - wVar13;
        inven_carry(ppVar7,obj,true,false);
        kind->everseen = true;
      }
LAB_001a22dd:
      psVar22 = psVar22->next;
    } while (psVar22 != (start_item *)0x0);
  }
  if (ppVar7->au < 0) {
    ppVar7->au = 0;
  }
  wield_all(ppVar7);
  update_player_object_knowledge(ppVar7);
  ppVar7 = player;
  player->is_dead = false;
  character_generated = true;
  ppVar7->upkeep->playing = true;
  cmd_disable_repeat();
  string_free(prev.history);
  prev.history = (char *)0x0;
  string_free(quickstart_prev.history);
  quickstart_prev.history = (char *)0x0;
  event_signal(EVENT_LEAVE_BIRTH);
  return;
}

Assistant:

void do_cmd_accept_character(struct command *cmd)
{
	options_init_cheat();

	roll_hp();

	ignore_birth_init();

	/* Clear old messages, add new starting message */
	history_clear(player);
	history_add(player, "Began the quest to destroy Morgoth.", HIST_PLAYER_BIRTH);

	/* Note player birth in the message recall */
	message_add(" ", MSG_GENERIC);
	message_add("  ", MSG_GENERIC);
	message_add("====================", MSG_GENERIC);
	message_add("  ", MSG_GENERIC);
	message_add(" ", MSG_GENERIC);

	/* Embody */
	player_embody(player);

	/* Give the player some money */
	get_money(player);

	/* Initialise the spells */
	player_spells_init(player);

	/* Know all runes for ID on walkover */
	if (OPT(player, birth_know_runes))
		player_learn_all_runes(player);

	/* Hack - player knows all combat runes.  Maybe make them not runes? NRM */
	player->obj_k->to_a = 1;
	player->obj_k->to_h = 1;
	player->obj_k->to_d = 1;

	/* Initialise the stores, dungeon */
	store_reset();
	chunk_list_max = 0;

	/* Player learns innate runes */
	player_learn_innate(player);

	/* Restore the standard artifacts (randarts may have been loaded) */
	cleanup_parser(&randart_parser);
	deactivate_randart_file();
	run_parser(&artifact_parser);

	/* Now only randomize the artifacts if required */
	if (OPT(player, birth_randarts)) {
		seed_randart = randint0(0x10000000);
		do_randart(seed_randart, true);
		deactivate_randart_file();
	}

	/* Seed for flavors */
	seed_flavor = randint0(0x10000000);
	flavor_init();

	/* Know all flavors for auto-ID of consumables */
	if (OPT(player, birth_know_flavors))
		flavor_set_all_aware();

	/* Outfit the player, if they can sell the stuff */
	player_outfit(player);

	/* Stop the player being quite so dead */
	player->is_dead = false;

	/* Character is now "complete" */
	character_generated = true;
	player->upkeep->playing = true;

	/* Disable repeat command, so we don't try to be born again */
	cmd_disable_repeat();

	/* No longer need the cached history. */
	string_free(prev.history);
	prev.history = NULL;
	string_free(quickstart_prev.history);
	quickstart_prev.history = NULL;

	/* Now we're really done.. */
	event_signal(EVENT_LEAVE_BIRTH);
}